

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  string *__lhs;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  cmState *this_01;
  string library;
  string notfound;
  
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar2 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xc])(this,argsIn);
  if (SUB41(iVar2,0) != false) {
    if ((this->super_cmFindBase).AlreadyInCache == true) {
      if ((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo == true) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,
                   &(this->super_cmFindBase).VariableName,"",
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
    }
    else {
      this_00 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      std::__cxx11::string::string
                ((string *)&library,"CMAKE_INTERNAL_PLATFORM_ABI",(allocator *)&notfound);
      pcVar3 = cmMakefile::GetDefinition(this_00,&library);
      std::__cxx11::string::~string((string *)&library);
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)&library,pcVar3,(allocator *)&notfound);
        lVar4 = std::__cxx11::string::find((char *)&library,0x4c6f13);
        if (lVar4 != -1) {
          AddArchitecturePaths(this,"32");
        }
        std::__cxx11::string::~string((string *)&library);
      }
      this_01 = cmMakefile::GetState
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
      std::__cxx11::string::string
                ((string *)&library,"FIND_LIBRARY_USE_LIB64_PATHS",(allocator *)&notfound);
      bVar1 = cmState::GetGlobalPropertyAsBool(this_01,&library);
      std::__cxx11::string::~string((string *)&library);
      if (bVar1) {
        bVar1 = cmMakefile::PlatformIs64Bit
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
        if (bVar1) {
          AddArchitecturePaths(this,"64");
        }
      }
      FindLibrary_abi_cxx11_(&library,this);
      bVar1 = std::operator!=(&library,"");
      __lhs = &(this->super_cmFindBase).VariableName;
      if (bVar1) {
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,__lhs,
                   library._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
      }
      else {
        std::operator+(&notfound,__lhs,"-NOTFOUND");
        cmMakefile::AddCacheDefinition
                  ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile,__lhs,
                   notfound._M_dataplus._M_p,
                   (this->super_cmFindBase).VariableDocumentation._M_dataplus._M_p,FILEPATH,false);
        std::__cxx11::string::~string((string *)&notfound);
      }
      std::__cxx11::string::~string((string *)&library);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool cmFindLibraryCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmState::FILEPATH);
      }
    return true;
    }

  if(const char* abi_name =
     this->Makefile->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI"))
    {
    std::string abi = abi_name;
    if(abi.find("ELF N32") != abi.npos)
      {
      // Convert lib to lib32.
      this->AddArchitecturePaths("32");
      }
    }

  if(this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    // add special 64 bit paths if this is a 64 bit compile.
    if(this->Makefile->PlatformIs64Bit())
      {
      this->AddArchitecturePaths("64");
      }
    }

  std::string library = this->FindLibrary();
  if(library != "")
    {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName,
                                       library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmState::FILEPATH);
    return true;
    }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName,
                                     notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmState::FILEPATH);
  return true;
}